

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::sse2::
     BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  uint uVar2;
  ulong uVar3;
  Geometry *this;
  undefined1 (*pauVar4) [16];
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  undefined4 uVar14;
  ulong unaff_R15;
  size_t mask;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar24;
  float fVar25;
  undefined1 auVar21 [16];
  float fVar26;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar27;
  float fVar32;
  float fVar33;
  undefined1 auVar28 [16];
  float fVar34;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1048 [8];
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [8];
  float fStack_1030;
  float fStack_102c;
  float local_1028 [4];
  ulong local_1018;
  undefined1 (*local_1010) [16];
  long local_1008;
  ulong local_1000;
  undefined1 local_ff8 [8];
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [8];
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [8];
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [8];
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [8];
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_f78 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_f70 = 0;
  fVar1 = (query->p).field_0.field_0.x;
  local_1038._4_4_ = (query->p).field_0.field_0.y;
  local_1048._4_4_ = (query->p).field_0.field_0.z;
  fVar43 = (context->query_radius).field_0.m128[0];
  fVar20 = (context->query_radius).field_0.m128[1];
  fVar24 = (context->query_radius).field_0.m128[2];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    fStack_f90 = 0.0;
    fStack_f94 = 0.0;
    local_f98 = query->radius * query->radius;
  }
  else {
    fVar25 = (context->query_radius).field_0.m128[0];
    fVar26 = (context->query_radius).field_0.m128[1];
    fStack_f90 = (context->query_radius).field_0.m128[2];
    fStack_f94 = (context->query_radius).field_0.m128[3];
    fStack_f90 = fStack_f90 * fStack_f90;
    fStack_f94 = fStack_f94 * fStack_f94;
    local_f98 = fStack_f90 + fVar26 * fVar26 + fVar25 * fVar25;
  }
  local_1010 = (undefined1 (*) [16])local_f68;
  auVar39._4_4_ = fVar1;
  auVar39._0_4_ = fVar1;
  auVar39._8_4_ = fVar1;
  auVar39._12_4_ = fVar1;
  local_1038._0_4_ = local_1038._4_4_;
  fStack_1030 = (float)local_1038._4_4_;
  fStack_102c = (float)local_1038._4_4_;
  local_1048._0_4_ = local_1048._4_4_;
  fStack_1040 = (float)local_1048._4_4_;
  fStack_103c = (float)local_1048._4_4_;
  bVar6 = false;
  local_1018 = unaff_R15;
  do {
    local_fc8 = fVar1 - fVar43;
    fStack_fc4 = fVar1 - fVar43;
    fStack_fc0 = fVar1 - fVar43;
    fStack_fbc = fVar1 - fVar43;
    local_fd8 = fVar1 + fVar43;
    fStack_fd4 = fVar1 + fVar43;
    fStack_fd0 = fVar1 + fVar43;
    fStack_fcc = fVar1 + fVar43;
    local_fe8._0_4_ = (float)local_1038._4_4_ - fVar20;
    local_fe8._4_4_ = (float)local_1038._4_4_ - fVar20;
    fStack_fe0 = (float)local_1038._4_4_ - fVar20;
    fStack_fdc = (float)local_1038._4_4_ - fVar20;
    local_fa8 = fVar20 + (float)local_1038._4_4_;
    fStack_fa4 = fVar20 + (float)local_1038._4_4_;
    fStack_fa0 = fVar20 + (float)local_1038._4_4_;
    fStack_f9c = fVar20 + (float)local_1038._4_4_;
    local_ff8._0_4_ = (float)local_1048._4_4_ - fVar24;
    local_ff8._4_4_ = (float)local_1048._4_4_ - fVar24;
    fStack_ff0 = (float)local_1048._4_4_ - fVar24;
    fStack_fec = (float)local_1048._4_4_ - fVar24;
    local_fb8._0_4_ = fVar24 + (float)local_1048._4_4_;
    local_fb8._4_4_ = fVar24 + (float)local_1048._4_4_;
    fStack_fb0 = fVar24 + (float)local_1048._4_4_;
    fStack_fac = fVar24 + (float)local_1048._4_4_;
    local_f88._0_4_ = fVar43 * fVar43;
    local_f88._4_4_ = fVar43 * fVar43;
    fStack_f80 = fVar43 * fVar43;
    fStack_f7c = fVar43 * fVar43;
    fStack_f8c = fStack_f94;
    fVar43 = local_f98;
    do {
      do {
        do {
          if (local_1010 == (undefined1 (*) [16])local_f78) {
            return bVar6;
          }
          pauVar4 = local_1010 + -1;
          local_1010 = local_1010 + -1;
        } while (fVar43 < *(float *)(*pauVar4 + 8));
        uVar8 = *(ulong *)*local_1010;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar8 & 8) == 0) {
              auVar18 = *(undefined1 (*) [16])(uVar8 + 0x20);
              auVar22 = *(undefined1 (*) [16])(uVar8 + 0x30);
              auVar21 = maxps(auVar39,auVar18);
              auVar21 = minps(auVar21,auVar22);
              auVar28 = maxps(_local_1038,*(undefined1 (*) [16])(uVar8 + 0x40));
              fVar20 = auVar21._0_4_ - fVar1;
              fVar24 = auVar21._4_4_ - fVar1;
              fVar25 = auVar21._8_4_ - fVar1;
              fVar26 = auVar21._12_4_ - fVar1;
              auVar21 = minps(auVar28,*(undefined1 (*) [16])(uVar8 + 0x50));
              auVar28 = maxps(_local_1048,*(undefined1 (*) [16])(uVar8 + 0x60));
              auVar28 = minps(auVar28,*(undefined1 (*) [16])(uVar8 + 0x70));
              fVar27 = auVar21._0_4_ - (float)local_1038._4_4_;
              fVar32 = auVar21._4_4_ - (float)local_1038._4_4_;
              fVar33 = auVar21._8_4_ - (float)local_1038._4_4_;
              fVar34 = auVar21._12_4_ - (float)local_1038._4_4_;
              fVar35 = auVar28._0_4_ - (float)local_1048._4_4_;
              fVar36 = auVar28._4_4_ - (float)local_1048._4_4_;
              fVar37 = auVar28._8_4_ - (float)local_1048._4_4_;
              fVar38 = auVar28._12_4_ - (float)local_1048._4_4_;
              local_1028[0] = fVar35 * fVar35 + fVar27 * fVar27 + fVar20 * fVar20;
              local_1028[1] = fVar36 * fVar36 + fVar32 * fVar32 + fVar24 * fVar24;
              local_1028[2] = fVar37 * fVar37 + fVar33 * fVar33 + fVar25 * fVar25;
              local_1028[3] = fVar38 * fVar38 + fVar34 * fVar34 + fVar26 * fVar26;
              auVar31._0_4_ =
                   -(uint)(auVar18._0_4_ <= auVar22._0_4_ && local_1028[0] <= (float)local_f88._0_4_
                          );
              auVar31._4_4_ =
                   -(uint)(auVar18._4_4_ <= auVar22._4_4_ && local_1028[1] <= (float)local_f88._4_4_
                          );
              auVar31._8_4_ = -(uint)(auVar18._8_4_ <= auVar22._8_4_ && local_1028[2] <= fStack_f80)
              ;
              auVar31._12_4_ =
                   -(uint)(auVar18._12_4_ <= auVar22._12_4_ && local_1028[3] <= fStack_f7c);
LAB_00de8097:
              uVar14 = movmskps((int)local_1018,auVar31);
              local_1018 = CONCAT44((int)(local_1018 >> 0x20),uVar14);
            }
          }
          else if ((uVar8 & 8) == 0) {
            auVar18 = *(undefined1 (*) [16])(uVar8 + 0x60);
            auVar22 = *(undefined1 (*) [16])(uVar8 + 0x20);
            auVar21 = *(undefined1 (*) [16])(uVar8 + 0x30);
            auVar28 = *(undefined1 (*) [16])(uVar8 + 0x40);
            auVar17 = *(undefined1 (*) [16])(uVar8 + 0x50);
            auVar19 = *(undefined1 (*) [16])(uVar8 + 0x70);
            auVar31 = maxps(auVar39,auVar22);
            auVar31 = minps(auVar31,auVar21);
            fVar20 = auVar31._0_4_ - fVar1;
            fVar25 = auVar31._4_4_ - fVar1;
            fVar27 = auVar31._8_4_ - fVar1;
            fVar33 = auVar31._12_4_ - fVar1;
            auVar31 = maxps(_local_1038,auVar28);
            auVar31 = minps(auVar31,auVar17);
            fVar35 = auVar31._0_4_ - (float)local_1038._4_4_;
            fVar36 = auVar31._4_4_ - (float)local_1038._4_4_;
            fVar37 = auVar31._8_4_ - (float)local_1038._4_4_;
            fVar38 = auVar31._12_4_ - (float)local_1038._4_4_;
            auVar31 = maxps(_local_1048,auVar18);
            auVar31 = minps(auVar31,auVar19);
            fVar24 = auVar31._0_4_ - (float)local_1048._4_4_;
            fVar26 = auVar31._4_4_ - (float)local_1048._4_4_;
            fVar32 = auVar31._8_4_ - (float)local_1048._4_4_;
            fVar34 = auVar31._12_4_ - (float)local_1048._4_4_;
            local_1028[0] = fVar24 * fVar24 + fVar35 * fVar35 + fVar20 * fVar20;
            local_1028[1] = fVar26 * fVar26 + fVar36 * fVar36 + fVar25 * fVar25;
            local_1028[2] = fVar32 * fVar32 + fVar37 * fVar37 + fVar27 * fVar27;
            local_1028[3] = fVar34 * fVar34 + fVar38 * fVar38 + fVar33 * fVar33;
            auVar31._0_4_ =
                 (uint)(((auVar18._0_4_ <= (float)local_fb8._0_4_ && local_fc8 <= auVar21._0_4_) &&
                        (auVar22._0_4_ <= local_fd8 && auVar28._0_4_ <= local_fa8)) &&
                       ((float)local_ff8._0_4_ <= auVar19._0_4_ &&
                       ((float)local_fe8._0_4_ <= auVar17._0_4_ && auVar22._0_4_ <= auVar21._0_4_)))
                 * -0x80000000;
            auVar31._4_4_ =
                 (uint)(((auVar18._4_4_ <= (float)local_fb8._4_4_ && fStack_fc4 <= auVar21._4_4_) &&
                        (auVar22._4_4_ <= fStack_fd4 && auVar28._4_4_ <= fStack_fa4)) &&
                       ((float)local_ff8._4_4_ <= auVar19._4_4_ &&
                       ((float)local_fe8._4_4_ <= auVar17._4_4_ && auVar22._4_4_ <= auVar21._4_4_)))
                 * -0x80000000;
            auVar31._8_4_ =
                 (uint)(((auVar18._8_4_ <= fStack_fb0 && fStack_fc0 <= auVar21._8_4_) &&
                        (auVar22._8_4_ <= fStack_fd0 && auVar28._8_4_ <= fStack_fa0)) &&
                       (fStack_ff0 <= auVar19._8_4_ &&
                       (fStack_fe0 <= auVar17._8_4_ && auVar22._8_4_ <= auVar21._8_4_))) *
                 -0x80000000;
            auVar31._12_4_ =
                 (uint)(((auVar18._12_4_ <= fStack_fac && fStack_fbc <= auVar21._12_4_) &&
                        (auVar22._12_4_ <= fStack_fcc && auVar28._12_4_ <= fStack_f9c)) &&
                       (fStack_fec <= auVar19._12_4_ &&
                       (fStack_fdc <= auVar17._12_4_ && auVar22._12_4_ <= auVar21._12_4_))) *
                 -0x80000000;
            goto LAB_00de8097;
          }
          if ((uVar8 & 8) == 0) {
            if (local_1018 == 0) {
              iVar7 = 4;
            }
            else {
              uVar11 = uVar8 & 0xfffffffffffffff0;
              lVar12 = 0;
              if (local_1018 != 0) {
                for (; (local_1018 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                }
              }
              iVar7 = 0;
              uVar8 = *(ulong *)(uVar11 + lVar12 * 8);
              uVar10 = local_1018 - 1 & local_1018;
              if (uVar10 != 0) {
                fVar20 = local_1028[lVar12];
                lVar12 = 0;
                if (uVar10 != 0) {
                  for (; (uVar10 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                  }
                }
                uVar3 = *(ulong *)(uVar11 + lVar12 * 8);
                fVar24 = local_1028[lVar12];
                uVar10 = uVar10 - 1 & uVar10;
                if (uVar10 == 0) {
                  if ((uint)fVar20 < (uint)fVar24) {
                    *(ulong *)*local_1010 = uVar3;
                    *(float *)(*local_1010 + 8) = fVar24;
                    local_1010 = local_1010 + 1;
                  }
                  else {
                    *(ulong *)*local_1010 = uVar8;
                    *(float *)(*local_1010 + 8) = fVar20;
                    local_1010 = local_1010 + 1;
                    uVar8 = uVar3;
                  }
                }
                else {
                  auVar18._8_4_ = fVar20;
                  auVar18._0_8_ = uVar8;
                  auVar18._12_4_ = 0;
                  auVar22._8_4_ = fVar24;
                  auVar22._0_8_ = uVar3;
                  auVar22._12_4_ = 0;
                  lVar12 = 0;
                  if (uVar10 != 0) {
                    for (; (uVar10 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                    }
                  }
                  uVar8 = *(ulong *)(uVar11 + lVar12 * 8);
                  fVar25 = local_1028[lVar12];
                  auVar21._8_4_ = fVar25;
                  auVar21._0_8_ = uVar8;
                  auVar21._12_4_ = 0;
                  uVar10 = uVar10 - 1 & uVar10;
                  if (uVar10 == 0) {
                    auVar29._8_4_ = -(uint)((int)fVar20 < (int)fVar24);
                    auVar29._4_4_ = auVar29._8_4_;
                    auVar29._0_4_ = auVar29._8_4_;
                    auVar29._12_4_ = auVar29._8_4_;
                    auVar28 = auVar18 & auVar29 | ~auVar29 & auVar22;
                    auVar18 = auVar22 & auVar29 | ~auVar29 & auVar18;
                    auVar30._8_4_ = -(uint)(auVar28._8_4_ < (int)fVar25);
                    auVar30._0_8_ = CONCAT44(auVar30._8_4_,auVar30._8_4_);
                    auVar30._12_4_ = auVar30._8_4_;
                    auVar22 = auVar21 & auVar30 | ~auVar30 & auVar28;
                    auVar16._8_4_ = -(uint)(auVar18._8_4_ < auVar22._8_4_);
                    auVar16._4_4_ = auVar16._8_4_;
                    auVar16._0_4_ = auVar16._8_4_;
                    auVar16._12_4_ = auVar16._8_4_;
                    *local_1010 = ~auVar16 & auVar18 | auVar22 & auVar16;
                    local_1010[1] = auVar18 & auVar16 | ~auVar16 & auVar22;
                    local_1010 = local_1010 + 2;
                    uVar8 = ~auVar30._0_8_ & uVar8 | auVar28._0_8_ & auVar30._0_8_;
                  }
                  else {
                    lVar12 = 0;
                    if (uVar10 != 0) {
                      for (; (uVar10 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                      }
                    }
                    fVar26 = local_1028[lVar12];
                    auVar42._8_4_ = fVar26;
                    auVar42._0_8_ = *(undefined8 *)(uVar11 + lVar12 * 8);
                    auVar42._12_4_ = 0;
                    auVar40._8_4_ = -(uint)((int)fVar20 < (int)fVar24);
                    auVar40._4_4_ = auVar40._8_4_;
                    auVar40._0_4_ = auVar40._8_4_;
                    auVar40._12_4_ = auVar40._8_4_;
                    auVar28 = auVar18 & auVar40 | ~auVar40 & auVar22;
                    auVar18 = auVar22 & auVar40 | ~auVar40 & auVar18;
                    auVar41._0_4_ = -(uint)((int)fVar25 < (int)fVar26);
                    auVar41._4_4_ = -(uint)((int)fVar25 < (int)fVar26);
                    auVar41._8_4_ = -(uint)((int)fVar25 < (int)fVar26);
                    auVar41._12_4_ = -(uint)((int)fVar25 < (int)fVar26);
                    auVar31 = auVar21 & auVar41 | ~auVar41 & auVar42;
                    auVar42 = ~auVar41 & auVar21 | auVar42 & auVar41;
                    auVar23._8_4_ = -(uint)(auVar18._8_4_ < auVar42._8_4_);
                    auVar23._4_4_ = auVar23._8_4_;
                    auVar23._0_4_ = auVar23._8_4_;
                    auVar23._12_4_ = auVar23._8_4_;
                    auVar21 = auVar18 & auVar23 | ~auVar23 & auVar42;
                    auVar19._8_4_ = -(uint)(auVar28._8_4_ < auVar31._8_4_);
                    auVar19._0_8_ = CONCAT44(auVar19._8_4_,auVar19._8_4_);
                    auVar19._12_4_ = auVar19._8_4_;
                    auVar22 = ~auVar19 & auVar28 | auVar31 & auVar19;
                    auVar17._8_4_ = -(uint)(auVar22._8_4_ < auVar21._8_4_);
                    auVar17._4_4_ = auVar17._8_4_;
                    auVar17._0_4_ = auVar17._8_4_;
                    auVar17._12_4_ = auVar17._8_4_;
                    *local_1010 = ~auVar23 & auVar18 | auVar42 & auVar23;
                    local_1010[1] = ~auVar17 & auVar22 | auVar21 & auVar17;
                    local_1010[2] = auVar22 & auVar17 | ~auVar17 & auVar21;
                    local_1010 = local_1010 + 3;
                    uVar8 = auVar28._0_8_ & auVar19._0_8_ | ~auVar19._0_8_ & auVar31._0_8_;
                  }
                }
              }
            }
          }
          else {
            iVar7 = 6;
          }
        } while (iVar7 == 0);
      } while ((iVar7 != 6) || (local_1008 = (ulong)((uint)uVar8 & 0xf) - 8, local_1008 == 0));
      lVar12 = (uVar8 & 0xfffffffffffffff0) + 0xa0;
      lVar15 = 0;
      uVar8 = 0;
      do {
        local_1000 = uVar8;
        lVar13 = -0x10;
        bVar9 = 0;
        do {
          uVar2 = *(uint *)(lVar12 + lVar13);
          if ((ulong)uVar2 == 0xffffffff) break;
          this = (context->scene->geometries).items[uVar2].ptr;
          context->geomID = uVar2;
          context->primID = *(uint *)(lVar12 + 0x10 + lVar13);
          bVar5 = Geometry::pointQuery(this,query,context);
          bVar9 = bVar9 | bVar5;
          lVar13 = lVar13 + 4;
        } while (lVar13 != 0);
        uVar8 = CONCAT71((int7)(local_1000 >> 8),(byte)local_1000 | bVar9);
        lVar15 = lVar15 + 1;
        lVar12 = lVar12 + 0xb0;
      } while (lVar15 != local_1008);
      fVar43 = local_f98;
    } while ((local_1000 & 1) == 0 && bVar9 == 0);
    fVar43 = (context->query_radius).field_0.m128[0];
    fVar20 = (context->query_radius).field_0.m128[1];
    fVar24 = (context->query_radius).field_0.m128[2];
    fStack_f94 = (context->query_radius).field_0.m128[3];
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      fStack_f90 = 0.0;
      fStack_f94 = 0.0;
      local_f98 = query->radius * query->radius;
    }
    else {
      fStack_f90 = fVar24 * fVar24;
      fStack_f94 = fStack_f94 * fStack_f94;
      local_f98 = fStack_f90 + fVar20 * fVar20 + fVar43 * fVar43;
    }
    bVar6 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }